

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void init_minq_luts(int *kf_low_m,int *kf_high_m,int *arfgf_low,int *arfgf_high,int *inter,int *rtc,
                   aom_bit_depth_t bit_depth)

{
  int iVar1;
  double in_RCX;
  double in_RDX;
  long in_RSI;
  long in_RDI;
  double in_R8;
  double in_R9;
  double maxq;
  int i;
  aom_bit_depth_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  aom_bit_depth_t bit_depth_00;
  
  for (bit_depth_00 = 0; (int)bit_depth_00 < 0x100; bit_depth_00 = bit_depth_00 + 1) {
    av1_convert_qindex_to_q(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)(in_RDI + (long)(int)bit_depth_00 * 4) = iVar1;
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)(in_RSI + (long)(int)bit_depth_00 * 4) = iVar1;
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)((long)in_RDX + (long)(int)bit_depth_00 * 4) = iVar1;
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)((long)in_RCX + (long)(int)bit_depth_00 * 4) = iVar1;
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)((long)in_R8 + (long)(int)bit_depth_00 * 4) = iVar1;
    iVar1 = get_minq_index(in_RDX,in_RCX,in_R8,in_R9,bit_depth_00);
    *(int *)((long)in_R9 + (long)(int)bit_depth_00 * 4) = iVar1;
  }
  return;
}

Assistant:

static void init_minq_luts(int *kf_low_m, int *kf_high_m, int *arfgf_low,
                           int *arfgf_high, int *inter, int *rtc,
                           aom_bit_depth_t bit_depth) {
  int i;
  for (i = 0; i < QINDEX_RANGE; i++) {
    const double maxq = av1_convert_qindex_to_q(i, bit_depth);
    kf_low_m[i] = get_minq_index(maxq, 0.000001, -0.0004, 0.150, bit_depth);
    kf_high_m[i] = get_minq_index(maxq, 0.0000021, -0.00125, 0.45, bit_depth);
    arfgf_low[i] = get_minq_index(maxq, 0.0000015, -0.0009, 0.30, bit_depth);
    arfgf_high[i] = get_minq_index(maxq, 0.0000021, -0.00125, 0.55, bit_depth);
    inter[i] = get_minq_index(maxq, 0.00000271, -0.00113, 0.90, bit_depth);
    rtc[i] = get_minq_index(maxq, 0.00000271, -0.00113, 0.70, bit_depth);
  }
}